

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O3

bool __thiscall ON_ObjRef_IRefID::Read(ON_ObjRef_IRefID *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  int minor_version;
  int major_version;
  int local_1bc;
  ulong local_1b8;
  uchar auStack_1b0 [8];
  double local_1a8 [16];
  ON_UUID local_128;
  undefined4 local_118;
  double local_110 [16];
  ON_COMPONENT_INDEX local_90;
  ON_ObjRefEvaluationParameter local_88;
  
  local_1b8._0_4_ = 0;
  local_1b8._4_2_ = 0;
  local_1b8._6_2_ = 0;
  auStack_1b0[0] = '\0';
  auStack_1b0[1] = '\0';
  auStack_1b0[2] = '\0';
  auStack_1b0[3] = '\0';
  auStack_1b0[4] = '\0';
  auStack_1b0[5] = '\0';
  auStack_1b0[6] = '\0';
  auStack_1b0[7] = '\0';
  pdVar4 = (double *)&ON_Xform::ZeroTransformation;
  pdVar5 = local_1a8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = *pdVar4;
    pdVar4 = pdVar4 + 1;
    pdVar5 = pdVar5 + 1;
  }
  local_128.Data1 = 0;
  local_128.Data2 = 0;
  local_128.Data3 = 0;
  local_128.Data4[0] = '\0';
  local_128.Data4[1] = '\0';
  local_128.Data4[2] = '\0';
  local_128.Data4[3] = '\0';
  local_128.Data4[4] = '\0';
  local_128.Data4[5] = '\0';
  local_128.Data4[6] = '\0';
  local_128.Data4[7] = '\0';
  local_118 = 0;
  pdVar4 = (double *)&ON_Xform::ZeroTransformation;
  pdVar5 = local_110;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = *pdVar4;
    pdVar4 = pdVar4 + 1;
    pdVar5 = pdVar5 + 1;
  }
  ON_COMPONENT_INDEX::ON_COMPONENT_INDEX(&local_90);
  ON_ObjRefEvaluationParameter::ON_ObjRefEvaluationParameter(&local_88);
  memcpy(this,&local_1b8,400);
  ON_ObjRefEvaluationParameter::~ON_ObjRefEvaluationParameter(&local_88);
  local_1b8 = local_1b8 & 0xffffffff00000000;
  local_1bc = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,(int *)&local_1b8,&local_1bc);
  if (!bVar1) {
    return false;
  }
  if (((((int)local_1b8 == 1) &&
       (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_iref_uuid), bVar1)) &&
      (bVar1 = ON_BinaryArchive::ReadXform(archive,&this->m_iref_xform), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_idef_uuid), bVar1)) {
    bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_idef_geometry_index);
    if ((!bVar1) || (local_1bc < 1)) goto LAB_0055cebe;
    bVar1 = ON_BinaryArchive::ReadComponentIndex(archive,&this->m_component_index);
    if (bVar1) {
      bVar1 = ON_ObjRefEvaluationParameter::Read(&this->m_evp,archive);
      goto LAB_0055cebe;
    }
  }
  bVar1 = false;
LAB_0055cebe:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_ObjRef_IRefID::Read( ON_BinaryArchive& archive )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( 
                          TCODE_ANONYMOUS_CHUNK, 
                          &major_version, 
                          &minor_version );
  if ( !rc )
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadUuid(m_iref_uuid);
    if (!rc) break;

    rc = archive.ReadXform(m_iref_xform);
    if (!rc) break;

    rc = archive.ReadUuid(m_idef_uuid);
    if (!rc) break;

    rc = archive.ReadInt(&m_idef_geometry_index);
    if (!rc) break;

    if ( minor_version >= 1 )
    {
      // 13 July 2006 - 1.1 - added m_component_index and m_evp
      rc = archive.ReadComponentIndex(m_component_index);
      if (!rc) break;

      rc = m_evp.Read(archive);
      if (!rc) break;
    }

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}